

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<char_const(&)[13]>::operator==
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[13]> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  lest *this_00;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = std::__cxx11::string::compare((char *)rhs);
  this_00 = *(lest **)this;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"==","");
  to_string<char[13],std::__cxx11::string>(&local_70,this_00,(char (*) [13])local_50,rhs,in_R8);
  __return_storage_ptr__->passed = iVar1 == 0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }